

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  TrafficLightsState *state;
  TrafficLights *this;
  
  state = (TrafficLightsState *)operator_new(0x10);
  GreenLight::GreenLight((GreenLight *)state);
  this = (TrafficLights *)operator_new(0x10);
  TrafficLights::TrafficLights(this,state);
  TrafficLights::run(this);
  (*this->_vptr_TrafficLights[1])(this);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	TrafficLightsState* state = new GreenLight();
	TrafficLights* lights = new TrafficLights(state);

	lights->run();

	delete lights;

	return 0;
}